

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O2

int __thiscall MeCab::POSIDGenerator::id(POSIDGenerator *this,char *feature)

{
  bool bVar1;
  int iVar2;
  char *__dest;
  size_t sVar3;
  size_t size;
  ostream *poVar4;
  scoped_fixed_array<char_*,_8192> col;
  scoped_fixed_array<char,_8192> buf;
  string tmp;
  
  buf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_00138e90;
  __dest = (char *)operator_new__(0x2000);
  buf.size_ = 0x2000;
  col._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_00139130;
  buf.ptr_ = __dest;
  col.ptr_ = (char **)operator_new__(0x10000);
  col.size_ = 0x2000;
  sVar3 = strlen(feature);
  if (sVar3 < 0x1fff) {
    sVar3 = 0x1fff;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe8);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"std::strlen(feature) < buf.size() - 1");
    poVar4 = std::operator<<(poVar4,"] ");
    std::operator<<(poVar4,"too long feature");
    die::~die((die *)&tmp);
    sVar3 = buf.size_ - 1;
    __dest = buf.ptr_;
  }
  strncpy(__dest,feature,sVar3);
  size = tokenizeCSV<char**>(buf.ptr_,col.ptr_,col.size_);
  if (col.size_ <= size) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xeb);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"n < col.size()");
    poVar4 = std::operator<<(poVar4,"] ");
    std::operator<<(poVar4,"too long CSV entities");
    die::~die((die *)&tmp);
  }
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = '\0';
  bVar1 = RewriteRules::rewrite(&this->rewrite_,size,col.ptr_,&tmp);
  if (bVar1) {
    iVar2 = atoi(tmp._M_dataplus._M_p);
  }
  else {
    iVar2 = -1;
  }
  std::__cxx11::string::~string((string *)&tmp);
  scoped_fixed_array<char_*,_8192>::~scoped_fixed_array(&col);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf);
  return iVar2;
}

Assistant:

int POSIDGenerator::id(const char *feature) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, BUF_SIZE> col;
  CHECK_DIE(std::strlen(feature) < buf.size() - 1) << "too long feature";
  std::strncpy(buf.get(), feature, buf.size() - 1);
  const size_t n = tokenizeCSV(buf.get(), col.get(), col.size());
  CHECK_DIE(n < col.size()) << "too long CSV entities";
  std::string tmp;
  if (!rewrite_.rewrite(n, const_cast<const char **>(col.get()), &tmp)) {
    return -1;
  }
  return std::atoi(tmp.c_str());
}